

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O3

string * stringFromFormattedCString_abi_cxx11_
                   (string *__return_storage_ptr__,char *message,__va_list_tag *arguments)

{
  int iVar1;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar2;
  vector<char,_std::allocator<char>_> buffer;
  va_list tempArguments;
  allocator_type local_51;
  vector<char,_std::allocator<char>_> local_50;
  undefined8 local_38;
  void *pvStack_30;
  void *local_28;
  
  local_38._0_4_ = arguments->gp_offset;
  local_38._4_4_ = arguments->fp_offset;
  pvStack_30 = arguments->overflow_arg_area;
  local_28 = arguments->reg_save_area;
  iVar1 = vsnprintf((char *)0x0,0,message,&local_38);
  std::vector<char,_std::allocator<char>_>::vector(&local_50,(long)(iVar1 + 1),&local_51);
  vsnprintf(local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start,
            (long)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,message,arguments);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((string *)__return_storage_ptr__,
             local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  psVar2 = extraout_RAX;
  if (local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    psVar2 = extraout_RAX_00;
  }
  return psVar2;
}

Assistant:

static const std::string stringFromFormattedCString(const char *message, va_list arguments)
{
    va_list tempArguments;
    va_copy(tempArguments, arguments);
    // We have to get the size of the final string.
    // We use vsnprintf with an empty buffer
    // (the function returns the number of characters that didn't fit the buffer)
    va_copy(tempArguments, arguments);
    int length = std::vsnprintf(NULL, 0, message, tempArguments);
    va_end(tempArguments);

    // We now have the size. We can create the real string.
    std::vector<char> buffer(length + 1);
    std::vsnprintf(buffer.data(), buffer.size(), message, arguments);

    return std::string(buffer.begin(), buffer.end());
}